

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O0

void __thiscall
Imf_3_3::Header::Header
          (Header *this,Box2i *displayWindow,Box2i *dataWindow,float pixelAspectRatio,
          V2f *screenWindowCenter,float screenWindowWidth,LineOrder lineOrder,
          Compression compression)

{
  undefined8 *in_RDI;
  Compression in_stack_00000284;
  LineOrder in_stack_00000288;
  float in_stack_0000028c;
  V2f *in_stack_00000290;
  float in_stack_0000029c;
  Box2i *in_stack_000002a0;
  Box2i *in_stack_000002a8;
  Header *in_stack_000002b0;
  
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  *in_RDI = 0;
  in_RDI[1] = 0;
  std::
  map<Imf_3_3::Name,_Imf_3_3::Attribute_*,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>_>
  ::map((map<Imf_3_3::Name,_Imf_3_3::Attribute_*,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>_>
         *)0x12d5a2);
  *(undefined1 *)(in_RDI + 6) = 0;
  staticInitialize();
  anon_unknown_1::initialize
            (in_stack_000002b0,in_stack_000002a8,in_stack_000002a0,in_stack_0000029c,
             in_stack_00000290,in_stack_0000028c,in_stack_00000288,in_stack_00000284);
  return;
}

Assistant:

Header::Header (
    const Box2i& displayWindow,
    const Box2i& dataWindow,
    float        pixelAspectRatio,
    const V2f&   screenWindowCenter,
    float        screenWindowWidth,
    LineOrder    lineOrder,
    Compression  compression)
    : _map (), _readsNothing (false)
{
    staticInitialize ();

    initialize (
        *this,
        displayWindow,
        dataWindow,
        pixelAspectRatio,
        screenWindowCenter,
        screenWindowWidth,
        lineOrder,
        compression);
}